

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::addCompileOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  StringPtr helpText_00;
  MainBuilder *pMVar1;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr title;
  StringPtr argumentTitle;
  StringPtr argumentTitle_00;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface> local_f0;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_e0;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_d0;
  char *local_c0;
  undefined8 uStack_b8;
  OptionName local_b0;
  char *local_a0;
  undefined8 uStack_98;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface> local_90;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:311:30)>
  local_80;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:310:45)>
  local_70;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:304:46)>
  local_60;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnp_c__:296:47)>
  local_50;
  OptionName local_40;
  undefined1 local_30;
  char *local_28;
  
  local_40.isLong = false;
  local_40.field_1.shortName = 'o';
  local_30 = 1;
  local_28 = "output";
  local_50.t = this;
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_90,&local_50);
  local_a0 = 
  "Generate source code for language <lang> in directory <dir> (default: current directory).  <lang> actually specifies a plugin to use.  If <lang> is a simple word, the compiler searches for a plugin called \'capnpc-<lang>\' in $PATH.  If <lang> is a file path containing slashes, it is interpreted as the exact plugin executable file name, and $PATH is not searched.  If <lang> is \'-\', the compiler dumps the request to standard output."
  ;
  uStack_98 = 0x1b2;
  helpText.content.size_ = 0x1b2;
  helpText.content.ptr =
       "Generate source code for language <lang> in directory <dir> (default: current directory).  <lang> actually specifies a plugin to use.  If <lang> is a simple word, the compiler searches for a plugin called \'capnpc-<lang>\' in $PATH.  If <lang> is a file path containing slashes, it is interpreted as the exact plugin executable file name, and $PATH is not searched.  If <lang> is \'-\', the compiler dumps the request to standard output."
  ;
  names._M_len = 2;
  names._M_array = &local_40;
  argumentTitle.content.size_ = 0xf;
  argumentTitle.content.ptr = "<lang>[:<dir>]";
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (builder,names,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_90
                      ,argumentTitle,helpText);
  local_b0.isLong = true;
  local_b0.field_1.longName = "src-prefix";
  local_60.t = this;
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_d0,&local_60);
  local_c0 = 
  "If a file specified for compilation starts with <prefix>, remove the prefix for the purpose of deciding the names of output files.  For example, the following command:\n    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\nwould generate the files corge/baz/qux.capnp.{h,c++}."
  ;
  uStack_b8 = 0x127;
  helpText_00.content.size_ = 0x127;
  helpText_00.content.ptr =
       "If a file specified for compilation starts with <prefix>, remove the prefix for the purpose of deciding the names of output files.  For example, the following command:\n    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\nwould generate the files corge/baz/qux.capnp.{h,c++}."
  ;
  names_00._M_len = 1;
  names_00._M_array = &local_b0;
  argumentTitle_00.content.size_ = 9;
  argumentTitle_00.content.ptr = "<prefix>";
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (pMVar1,names_00,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_d0,
                      argumentTitle_00,helpText_00);
  local_70.t = this;
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_e0,&local_70);
  title.content.size_ = 9;
  title.content.ptr = "<source>";
  pMVar1 = kj::MainBuilder::expectOneOrMoreArgs
                     (pMVar1,title,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_e0)
  ;
  local_80.t = this;
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_f0,&local_80);
  kj::MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_f0);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface>::dispose(&local_f0);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_e0);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_d0);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose(&local_90);
  return;
}

Assistant:

void addCompileOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, addOutput), "<lang>[:<dir>]",
                             "Generate source code for language <lang> in directory <dir> "
                             "(default: current directory).  <lang> actually specifies a plugin "
                             "to use.  If <lang> is a simple word, the compiler searches for a plugin "
                             "called 'capnpc-<lang>' in $PATH.  If <lang> is a file path "
                             "containing slashes, it is interpreted as the exact plugin "
                             "executable file name, and $PATH is not searched.  If <lang> is '-', "
                             "the compiler dumps the request to standard output.")
           .addOptionWithArg({"src-prefix"}, KJ_BIND_METHOD(*this, addSourcePrefix), "<prefix>",
                             "If a file specified for compilation starts with <prefix>, remove "
                             "the prefix for the purpose of deciding the names of output files.  "
                             "For example, the following command:\n"
                             "    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\n"
                             "would generate the files corge/baz/qux.capnp.{h,c++}.")
           .expectOneOrMoreArgs("<source>", KJ_BIND_METHOD(*this, addSource))
           .callAfterParsing(KJ_BIND_METHOD(*this, generateOutput));
  }